

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_sum_intra_stats(AV1_COMMON *cm,FRAME_COUNTS *counts,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,
                        MB_MODE_INFO *above_mi,MB_MODE_INFO *left_mi,int intraonly)

{
  byte bVar1;
  int iVar2;
  aom_cdf_prob *cdf;
  BLOCK_SIZE *in_RCX;
  long in_RDX;
  long in_RDI;
  MACROBLOCKD *in_R9;
  int in_stack_00000008;
  PREDICTION_MODE intra_mode;
  aom_cdf_prob *cdf_v;
  aom_cdf_prob *cdf_u;
  uint8_t idx;
  int8_t joint_sign;
  CFL_ALLOWED_TYPE cfl_allowed;
  UV_PREDICTION_MODE uv_mode;
  int use_filter_intra_mode;
  BLOCK_SIZE bsize;
  PREDICTION_MODE y_mode;
  FRAME_CONTEXT *fc;
  MB_MODE_INFO *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  MB_MODE_INFO *in_stack_ffffffffffffffa8;
  FRAME_CONTEXT *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbc;
  BLOCK_SIZE BVar3;
  undefined1 in_stack_ffffffffffffffbd;
  BLOCK_SIZE val;
  undefined1 in_stack_ffffffffffffffbe;
  BLOCK_SIZE mode;
  uint in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  BLOCK_SIZE bsize_00;
  BLOCK_SIZE val_00;
  MB_MODE_INFO *mbmi_00;
  
  mbmi_00 = *(MB_MODE_INFO **)(in_RDX + 0x2998);
  val_00 = in_RCX[2];
  bsize_00 = *in_RCX;
  if (in_stack_00000008 == 0) {
    update_cdf((aom_cdf_prob *)
               ((long)mbmi_00[0x48].wm_params.wmmat + (ulong)""[bsize_00] * 0x1c + 0x1a),val_00,0xd)
    ;
  }
  else {
    cdf = get_y_mode_cdf(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         (MB_MODE_INFO *)
                         CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    update_cdf(cdf,val_00,0xd);
  }
  iVar2 = av1_filter_intra_allowed
                    ((AV1_COMMON *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  if (iVar2 != 0) {
    in_stack_ffffffffffffffc0 = (uint)in_RCX[0x5b];
    update_cdf((aom_cdf_prob *)(mbmi_00[0x47].angle_delta + (ulong)*in_RCX * 6 + -0x16),in_RCX[0x5b]
               ,2);
    if (in_stack_ffffffffffffffc0 != 0) {
      update_cdf(&mbmi_00[0x48].interp_filters.as_filters.x_filter,in_RCX[0x5a],5);
    }
  }
  iVar2 = av1_is_directional_mode(in_RCX[2]);
  if ((iVar2 != 0) && (iVar2 = av1_use_angle_delta(bsize_00), iVar2 != 0)) {
    update_cdf(mbmi_00[0x54].palette_mode_info.palette_colors + (long)(int)(in_RCX[2] - 1) * 8 + 4,
               in_RCX[0x58] + BLOCK_8X8,7);
  }
  if ((*(byte *)(in_RDX + 0xc) & 1) != 0) {
    mode = in_RCX[3];
    bVar1 = is_cfl_allowed((MACROBLOCKD *)
                           CONCAT17(mode,CONCAT16(in_stack_ffffffffffffffbe,
                                                  CONCAT15(in_stack_ffffffffffffffbd,
                                                           CONCAT14(in_stack_ffffffffffffffbc,
                                                                    in_stack_ffffffffffffffb8)))));
    update_cdf((aom_cdf_prob *)
               ((long)mbmi_00 + (ulong)val_00 * 0x1e + (ulong)bVar1 * 0x186 + 0x3226),mode,
               0xe - (uint)((bVar1 != 0 ^ 0xffU) & 1));
    if (mode == BLOCK_64X128) {
      val = in_RCX[0x5c];
      BVar3 = in_RCX[0x5d];
      update_cdf((aom_cdf_prob *)((long)&mbmi_00[0x77].interinter_comp.seg_mask + 2),val,8);
      if (((char)val + 1) * 0xb >> 5 != 0) {
        update_cdf(mbmi_00[0x77].palette_mode_info.palette_colors +
                   (long)((char)val + -2) * 0x11 + -1,(int8_t)((int)(uint)BVar3 >> 4),0x10);
      }
      if ((char)val + 1 + (((char)val + 1) * 0xb >> 5) * -3 != 0) {
        update_cdf(mbmi_00[0x77].palette_mode_info.palette_colors +
                   (long)(((char)val + 1 + (((char)val + 1) * 0xb >> 5) * -3) * 3 +
                          (((char)val + 1) * 0xb >> 5) + -3) * 0x11 + -1,BVar3 & BLOCK_128X128,0x10)
        ;
      }
    }
    bVar1 = get_uv_mode(mode);
    iVar2 = av1_is_directional_mode(bVar1);
    if ((iVar2 != 0) && (iVar2 = av1_use_angle_delta(bsize_00), iVar2 != 0)) {
      update_cdf(mbmi_00[0x54].palette_mode_info.palette_colors + (long)(int)(bVar1 - 1) * 8 + 4,
                 in_RCX[0x59] + BLOCK_8X8,7);
    }
    iVar2 = av1_allow_palette((uint)(*(byte *)(in_RDI + 0x1ef) & 1),bsize_00);
    if (iVar2 != 0) {
      update_palette_cdf(in_R9,mbmi_00,
                         (FRAME_COUNTS *)
                         CONCAT17(val_00,CONCAT16(bsize_00,CONCAT24(in_stack_ffffffffffffffc4,
                                                                    in_stack_ffffffffffffffc0))));
    }
  }
  return;
}

Assistant:

void av1_sum_intra_stats(const AV1_COMMON *const cm, FRAME_COUNTS *counts,
                         MACROBLOCKD *xd, const MB_MODE_INFO *const mbmi,
                         const MB_MODE_INFO *above_mi,
                         const MB_MODE_INFO *left_mi, const int intraonly) {
  FRAME_CONTEXT *fc = xd->tile_ctx;
  const PREDICTION_MODE y_mode = mbmi->mode;
  (void)counts;
  const BLOCK_SIZE bsize = mbmi->bsize;

  if (intraonly) {
#if CONFIG_ENTROPY_STATS
    const PREDICTION_MODE above = av1_above_block_mode(above_mi);
    const PREDICTION_MODE left = av1_left_block_mode(left_mi);
    const int above_ctx = intra_mode_context[above];
    const int left_ctx = intra_mode_context[left];
    ++counts->kf_y_mode[above_ctx][left_ctx][y_mode];
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(get_y_mode_cdf(fc, above_mi, left_mi), y_mode, INTRA_MODES);
  } else {
#if CONFIG_ENTROPY_STATS
    ++counts->y_mode[size_group_lookup[bsize]][y_mode];
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(fc->y_mode_cdf[size_group_lookup[bsize]], y_mode, INTRA_MODES);
  }

  if (av1_filter_intra_allowed(cm, mbmi)) {
    const int use_filter_intra_mode =
        mbmi->filter_intra_mode_info.use_filter_intra;
#if CONFIG_ENTROPY_STATS
    ++counts->filter_intra[mbmi->bsize][use_filter_intra_mode];
    if (use_filter_intra_mode) {
      ++counts
            ->filter_intra_mode[mbmi->filter_intra_mode_info.filter_intra_mode];
    }
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(fc->filter_intra_cdfs[mbmi->bsize], use_filter_intra_mode, 2);
    if (use_filter_intra_mode) {
      update_cdf(fc->filter_intra_mode_cdf,
                 mbmi->filter_intra_mode_info.filter_intra_mode,
                 FILTER_INTRA_MODES);
    }
  }
  if (av1_is_directional_mode(mbmi->mode) && av1_use_angle_delta(bsize)) {
#if CONFIG_ENTROPY_STATS
    ++counts->angle_delta[mbmi->mode - V_PRED]
                         [mbmi->angle_delta[PLANE_TYPE_Y] + MAX_ANGLE_DELTA];
#endif
    update_cdf(fc->angle_delta_cdf[mbmi->mode - V_PRED],
               mbmi->angle_delta[PLANE_TYPE_Y] + MAX_ANGLE_DELTA,
               2 * MAX_ANGLE_DELTA + 1);
  }

  if (!xd->is_chroma_ref) return;

  const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
  const CFL_ALLOWED_TYPE cfl_allowed = is_cfl_allowed(xd);
#if CONFIG_ENTROPY_STATS
  ++counts->uv_mode[cfl_allowed][y_mode][uv_mode];
#endif  // CONFIG_ENTROPY_STATS
  update_cdf(fc->uv_mode_cdf[cfl_allowed][y_mode], uv_mode,
             UV_INTRA_MODES - !cfl_allowed);
  if (uv_mode == UV_CFL_PRED) {
    const int8_t joint_sign = mbmi->cfl_alpha_signs;
    const uint8_t idx = mbmi->cfl_alpha_idx;

#if CONFIG_ENTROPY_STATS
    ++counts->cfl_sign[joint_sign];
#endif
    update_cdf(fc->cfl_sign_cdf, joint_sign, CFL_JOINT_SIGNS);
    if (CFL_SIGN_U(joint_sign) != CFL_SIGN_ZERO) {
      aom_cdf_prob *cdf_u = fc->cfl_alpha_cdf[CFL_CONTEXT_U(joint_sign)];

#if CONFIG_ENTROPY_STATS
      ++counts->cfl_alpha[CFL_CONTEXT_U(joint_sign)][CFL_IDX_U(idx)];
#endif
      update_cdf(cdf_u, CFL_IDX_U(idx), CFL_ALPHABET_SIZE);
    }
    if (CFL_SIGN_V(joint_sign) != CFL_SIGN_ZERO) {
      aom_cdf_prob *cdf_v = fc->cfl_alpha_cdf[CFL_CONTEXT_V(joint_sign)];

#if CONFIG_ENTROPY_STATS
      ++counts->cfl_alpha[CFL_CONTEXT_V(joint_sign)][CFL_IDX_V(idx)];
#endif
      update_cdf(cdf_v, CFL_IDX_V(idx), CFL_ALPHABET_SIZE);
    }
  }
  const PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
  if (av1_is_directional_mode(intra_mode) && av1_use_angle_delta(bsize)) {
#if CONFIG_ENTROPY_STATS
    ++counts->angle_delta[intra_mode - V_PRED]
                         [mbmi->angle_delta[PLANE_TYPE_UV] + MAX_ANGLE_DELTA];
#endif
    update_cdf(fc->angle_delta_cdf[intra_mode - V_PRED],
               mbmi->angle_delta[PLANE_TYPE_UV] + MAX_ANGLE_DELTA,
               2 * MAX_ANGLE_DELTA + 1);
  }
  if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize)) {
    update_palette_cdf(xd, mbmi, counts);
  }
}